

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::Session::Session(Session *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  long *plVar2;
  element_type *peVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  element_type *peVar5;
  int iVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__tmp;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar7;
  undefined4 extraout_var;
  undefined8 uVar9;
  Colour colourGuard;
  long local_e0;
  ReusableStringStream local_d8 [2];
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_a8;
  Parser local_a0;
  SourceLineInfo local_40;
  long *plVar8;
  
  (this->super_NonCopyable)._vptr_NonCopyable = (_func_int **)&PTR__Session_002432a8;
  (this->m_cli).super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_002459d0;
  (this->m_cli).m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase
  ._vptr_ParserBase = (_func_int **)&PTR__ExeName_002452e0;
  local_a8 = &(this->m_cli).m_exeName.m_name;
  (this->m_cli).m_exeName.m_name.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  this_00 = &(this->m_cli).m_exeName.m_name.
             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<std::__cxx11::string,std::allocator<std::__cxx11::string>,char_const(&)[13]>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_00,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_a8,
             (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_a0,(char (*) [13])"<executable>");
  *(undefined8 *)
   ((long)&(this->m_cli).m_args.
           super__Vector_base<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 3) = 0;
  (this->m_configData).listTestNamesOnly = false;
  (this->m_configData).showSuccessfulTests = false;
  (this->m_configData).shouldDebugBreak = false;
  (this->m_configData).noThrow = false;
  (this->m_configData).showHelp = false;
  (this->m_configData).showInvisibles = false;
  (this->m_configData).filenamesAsTags = false;
  (this->m_configData).libIdentify = false;
  (this->m_cli).m_args.
  super__Vector_base<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_cli).m_args.
  super__Vector_base<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_cli).m_options.
  super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_cli).m_args.
  super__Vector_base<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_cli).m_options.
  super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_cli).m_options.
  super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_cli).m_exeName.m_ref.
  super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_cli).m_exeName.m_ref.
  super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_configData).abortAfter = -1;
  (this->m_configData).rngSeed = 0;
  (this->m_configData).benchmarkNoAnalysis = false;
  (this->m_configData).benchmarkSamples = 100;
  (this->m_configData).benchmarkConfidenceInterval = 0.95;
  (this->m_configData).benchmarkResamples = 100000;
  (this->m_configData).benchmarkWarmupTime = 100;
  (this->m_configData).verbosity = Normal;
  (this->m_configData).warnings = Nothing;
  (this->m_configData).showDurations = DefaultForReporter;
  (this->m_configData).minDuration = -1.0;
  (this->m_configData).runOrder = InDeclarationOrder;
  (this->m_configData).useColour = Auto;
  (this->m_configData).waitForKeypress = Never;
  (this->m_configData).outputFilename._M_dataplus._M_p =
       (pointer)&(this->m_configData).outputFilename.field_2;
  (this->m_configData).outputFilename._M_string_length = 0;
  (this->m_configData).outputFilename.field_2._M_local_buf[0] = '\0';
  (this->m_configData).name._M_dataplus._M_p = (pointer)&(this->m_configData).name.field_2;
  (this->m_configData).name._M_string_length = 0;
  (this->m_configData).name.field_2._M_local_buf[0] = '\0';
  (this->m_configData).processName._M_dataplus._M_p =
       (pointer)&(this->m_configData).processName.field_2;
  (this->m_configData).processName._M_string_length = 0;
  (this->m_configData).processName.field_2._M_local_buf[0] = '\0';
  (this->m_configData).reporterName._M_dataplus._M_p =
       (pointer)&(this->m_configData).reporterName.field_2;
  *(undefined4 *)((long)&(this->m_configData).reporterName.field_2 + 3) = 0x656c6f73;
  *(undefined4 *)&(this->m_configData).reporterName.field_2 = 0x736e6f63;
  (this->m_configData).reporterName._M_string_length = 7;
  (this->m_configData).reporterName.field_2._M_local_buf[7] = '\0';
  (this->m_configData).testsOrTags.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_configData).testsOrTags.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_configData).testsOrTags.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_configData).sectionsToRun.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_configData).sectionsToRun.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_configData).sectionsToRun.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->m_startupExceptions = false;
  if (Session()::alreadyInstantiated == '\x01') {
    ReusableStringStream::ReusableStringStream(local_d8);
    local_40.file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/tinfoilboy[P]sonne/extern/Catch2/single_include/catch2/catch.hpp"
    ;
    local_40.line = 0x3458;
    operator<<(local_d8[0].m_oss,&local_40);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d8[0].m_oss,": Internal Catch2 error: ",0x19);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d8[0].m_oss,"Only one instance of Catch::Session can ever be used",
               0x34);
    std::__cxx11::stringbuf::str();
    throw_logic_error((string *)&local_a0);
  }
  do {
    pSVar7 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
             ::getInternal();
    iVar6 = (*(pSVar7->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[6])(pSVar7);
    plVar8 = (long *)CONCAT44(extraout_var,iVar6);
    if (*plVar8 == plVar8[1]) {
LAB_001ba54d:
      Session()::alreadyInstantiated = '\x01';
      makeCommandLineParser(&local_a0,&this->m_configData);
      _Var4._M_pi = local_a0.m_exeName.m_name.
                    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      peVar3 = local_a0.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      local_a0.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_a0.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (local_a8->
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      )._M_ptr = peVar3;
      p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00->_M_pi;
      this_00->_M_pi = _Var4._M_pi;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      }
      _Var4._M_pi = local_a0.m_exeName.m_ref.
                    super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      peVar5 = local_a0.m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      local_a0.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)0x0;
      local_a0.m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               (this->m_cli).m_exeName.m_ref.
               super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
      (this->m_cli).m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = peVar5;
      (this->m_cli).m_exeName.m_ref.
      super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Var4._M_pi;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      }
      local_d8[0].super_NonCopyable._vptr_NonCopyable =
           (_func_int **)
           (this->m_cli).m_options.
           super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_d8[0].m_index =
           (size_t)(this->m_cli).m_options.
                   super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      local_d8[0].m_oss =
           (ostream *)
           (this->m_cli).m_options.
           super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (this->m_cli).m_options.
      super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>.
      _M_impl.super__Vector_impl_data._M_start =
           local_a0.m_options.
           super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (this->m_cli).m_options.
      super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_a0.m_options.
           super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      (this->m_cli).m_options.
      super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_a0.m_options.
           super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_a0.m_options.
      super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a0.m_options.
      super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a0.m_options.
      super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::
      ~vector((vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_> *)
              local_d8);
      local_d8[0].super_NonCopyable._vptr_NonCopyable =
           (_func_int **)
           (this->m_cli).m_args.
           super__Vector_base<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_d8[0].m_index =
           (size_t)(this->m_cli).m_args.
                   super__Vector_base<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      local_d8[0].m_oss =
           (ostream *)
           (this->m_cli).m_args.
           super__Vector_base<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (this->m_cli).m_args.
      super__Vector_base<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>.
      _M_impl.super__Vector_impl_data._M_start =
           local_a0.m_args.
           super__Vector_base<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (this->m_cli).m_args.
      super__Vector_base<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_a0.m_args.
           super__Vector_base<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      (this->m_cli).m_args.
      super__Vector_base<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_a0.m_args.
           super__Vector_base<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_a0.m_args.
      super__Vector_base<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a0.m_args.
      super__Vector_base<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a0.m_args.
      super__Vector_base<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::
      ~vector((vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_> *)
              local_d8);
      local_a0.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_002459d0;
      clara::std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::
      ~vector(&local_a0.m_args);
      clara::std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::
      ~vector(&local_a0.m_options);
      local_a0.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
      _vptr_ParserBase = (ParserBase)&PTR__ExeName_002452e0;
      if (local_a0.m_exeName.m_ref.
          super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_a0.m_exeName.m_ref.
                   super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_a0.m_exeName.m_name.
          super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_a0.m_exeName.m_name.
                   super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      return;
    }
    config(this);
    if (IMutableContext::currentContext == (long *)0x0) {
      IMutableContext::currentContext = (long *)operator_new(0x30);
      *IMutableContext::currentContext = 0;
      IMutableContext::currentContext[1] = 0;
      IMutableContext::currentContext[4] = 0;
      IMutableContext::currentContext[5] = 0;
      IMutableContext::currentContext[2] = 0;
      IMutableContext::currentContext[3] = 0;
      *IMutableContext::currentContext = (long)&PTR__Context_00242c40;
      IMutableContext::currentContext[1] = (long)&PTR__Context_00242c90;
    }
    plVar2 = IMutableContext::currentContext;
    local_a0.super_ParserBase._vptr_ParserBase =
         (_func_int **)
         (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_a0.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.super_ParserBase.
    _vptr_ParserBase =
         (ParserBase)
         (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    if (local_a0.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.
        super_ParserBase._vptr_ParserBase != (_func_int **)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)
         ((long)local_a0.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.
                super_ParserBase._vptr_ParserBase + 8) =
             *(_Atomic_word *)
              ((long)local_a0.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.
                     super_ParserBase._vptr_ParserBase + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)
         ((long)local_a0.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.
                super_ParserBase._vptr_ParserBase + 8) =
             *(_Atomic_word *)
              ((long)local_a0.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.
                     super_ParserBase._vptr_ParserBase + 8) + 1;
      }
    }
    (**(code **)(*plVar2 + 0x38))(plVar2,&local_a0);
    if (local_a0.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.
        super_ParserBase._vptr_ParserBase != (_func_int **)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_a0.m_exeName.super_ComposableParserImpl<Catch::clara::detail::ExeName>.
                 super_ParserBase._vptr_ParserBase);
    }
    this->m_startupExceptions = true;
    Colour::use(Red);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Errors occurred during startup!",0x1f);
    local_a0.super_ParserBase._vptr_ParserBase._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,(char *)&local_a0,1);
    if ((long *)*plVar8 == (long *)plVar8[1]) {
      Colour::use(None);
      goto LAB_001ba54d;
    }
    local_e0 = *(long *)*plVar8;
    if (local_e0 != 0) {
      std::__exception_ptr::exception_ptr::_M_addref();
    }
    uVar9 = std::rethrow_exception((exception_ptr)&local_e0);
    if ((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)local_a0.super_ParserBase._vptr_ParserBase != &local_a0.m_exeName.m_name) {
      operator_delete(local_a0.super_ParserBase._vptr_ParserBase);
    }
    ReusableStringStream::~ReusableStringStream(local_d8);
    __cxa_begin_catch(uVar9);
    pSVar7 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
             ::getInternal();
    (*(pSVar7->super_RegistryHub).super_IMutableRegistryHub._vptr_IMutableRegistryHub[7])
              (&(pSVar7->super_RegistryHub).super_IMutableRegistryHub);
    __cxa_end_catch();
  } while( true );
}

Assistant:

Session::Session() {
        static bool alreadyInstantiated = false;
        if( alreadyInstantiated ) {
            CATCH_TRY { CATCH_INTERNAL_ERROR( "Only one instance of Catch::Session can ever be used" ); }
            CATCH_CATCH_ALL { getMutableRegistryHub().registerStartupException(); }